

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-internal.h
# Opt level: O2

Test * __thiscall
testing::internal::TestFactoryImpl<leveldb::CacheTest_HitAndMiss_Test>::CreateTest
          (TestFactoryImpl<leveldb::CacheTest_HitAndMiss_Test> *this)

{
  Test *this_00;
  
  this_00 = (Test *)operator_new(0x48);
  leveldb::CacheTest_HitAndMiss_Test::CacheTest_HitAndMiss_Test
            ((CacheTest_HitAndMiss_Test *)this_00);
  return this_00;
}

Assistant:

Test* CreateTest() override { return new TestClass; }